

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
process_final_deregs_if_any
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
           *this)

{
  bool bVar1;
  reference ppcVar2;
  coop_t *ptr;
  iterator __end4;
  iterator __begin4;
  final_dereg_coop_container_t *__range4;
  final_dereg_coop_container_t coops;
  env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
  *this_local;
  
  coops.super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)this;
  while( true ) {
    bVar1 = std::deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::empty
                      (&this->m_final_dereg_coops);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::deque
              ((deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_> *)&__range4);
    std::deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::swap
              ((deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_> *)&__range4,
               &this->m_final_dereg_coops);
    std::deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::begin
              ((iterator *)&__end4._M_node,
               (deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_> *)&__range4);
    std::deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::end
              ((iterator *)&ptr,(deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_> *)&__range4)
    ;
    while( true ) {
      bVar1 = std::operator!=((_Self *)&__end4._M_node,(_Self *)&ptr);
      if (!bVar1) break;
      ppcVar2 = std::_Deque_iterator<so_5::coop_t_*,_so_5::coop_t_*&,_so_5::coop_t_**>::operator*
                          ((_Deque_iterator<so_5::coop_t_*,_so_5::coop_t_*&,_so_5::coop_t_**> *)
                           &__end4._M_node);
      coop_t::call_final_deregister_coop(*ppcVar2);
      std::_Deque_iterator<so_5::coop_t_*,_so_5::coop_t_*&,_so_5::coop_t_**>::operator++
                ((_Deque_iterator<so_5::coop_t_*,_so_5::coop_t_*&,_so_5::coop_t_**> *)
                 &__end4._M_node);
    }
    std::deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::~deque
              ((deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_> *)&__range4);
  }
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::process_final_deregs_if_any()
	{
		// This loop is necessary because it is possible that new
		// final dereg demand will be added during processing of
		// the current final dereg demand.
		while( !m_final_dereg_coops.empty() )
			{
				final_dereg_coop_container_t coops;
				coops.swap( m_final_dereg_coops );

				for( auto ptr : coops )
					coop_t::call_final_deregister_coop( ptr );
			}
	}